

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  char *pcVar1;
  LodePNGColorType colortype;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  bool bVar15;
  ucvector v;
  uchar *data;
  size_t datasize;
  uint b;
  uint g;
  uint r;
  LodePNGInfo info;
  LodePNGColorMode result;
  LodePNGColorStats stats;
  ucvector local_6a8;
  LodePNGEncoderSettings *local_690;
  uint local_684;
  LodePNGColorMode *local_680;
  uchar *local_678;
  size_t local_670;
  uint local_664;
  uint local_660;
  uint local_65c;
  LodePNGColorMode local_658;
  LodePNGInfo local_630;
  LodePNGColorMode local_488;
  LodePNGColorStats local_460;
  
  local_678 = (uchar *)0x0;
  local_670 = 0;
  local_6a8.allocsize = 0;
  local_6a8.data = (uchar *)0x0;
  local_6a8.size = 0;
  local_630.color.key_defined = 0;
  local_630.color.key_r = 0;
  local_630.color.key_g = 0;
  local_630.color.key_b = 0;
  local_630.color.colortype = LCT_RGBA;
  local_630.color.bitdepth = 8;
  local_630.color.palette = (uchar *)0x0;
  local_630.color.palettesize = 0;
  local_630.interlace_method = 0;
  local_630.compression_method = 0;
  local_630.filter_method = 0;
  local_630.phys_defined = 0;
  local_630.gama_defined = 0;
  local_630.chrm_defined = 0;
  local_630.srgb_defined = 0;
  local_630.unknown_chunks_data[0] = (uchar *)0x0;
  local_630.unknown_chunks_data[1] = (uchar *)0x0;
  local_630.unknown_chunks_data[2] = (uchar *)0x0;
  local_630.unknown_chunks_size[0] = 0;
  local_630.unknown_chunks_size[1] = 0;
  local_630.unknown_chunks_size[2] = 0;
  local_630.background_defined = 0;
  local_630.background_r = 0;
  local_630.background_g = 0;
  local_630.background_b = 0;
  local_630.text_num = 0;
  local_630.text_keys = (char **)0x0;
  local_630.text_strings = (char **)0x0;
  local_630.itext_num = 0;
  local_630.itext_keys = (char **)0x0;
  local_630.itext_langtags = (char **)0x0;
  local_630.itext_transkeys = (char **)0x0;
  local_630.itext_strings = (char **)0x0;
  local_630.exif_defined = 0;
  local_630.exif = (uchar *)0x0;
  local_630.exif_size = 0;
  local_630.time_defined = 0;
  local_630._252_8_ = 0;
  local_630._260_8_ = 0;
  local_630.iccp_profile._4_4_ = 0;
  local_630.cicp_defined = 0;
  local_630.cicp_color_primaries = 0;
  local_630.cicp_transfer_function = 0;
  local_630.cicp_matrix_coefficients = 0;
  local_630.cicp_video_full_range_flag = 0;
  local_630.mdcv_defined = 0;
  local_630.mdcv_red_x = 0;
  local_630.mdcv_red_y = 0;
  local_630.mdcv_green_x = 0;
  local_630.mdcv_green_y = 0;
  local_630.mdcv_blue_x = 0;
  local_630.mdcv_blue_y = 0;
  local_630.mdcv_white_x = 0;
  local_630.mdcv_white_y = 0;
  local_630.mdcv_max_luminance = 0;
  local_630.mdcv_min_luminance = 0;
  local_630.clli_defined = 0;
  local_630.clli_max_cll = 0;
  local_630.clli_max_fall = 0;
  local_630.sbit_defined = 0;
  local_630.sbit_r = 0;
  local_630.sbit_g = 0;
  local_630.sbit_b = 0;
  local_630.sbit_a = 0;
  local_658.key_defined = 0;
  local_658.key_r = 0;
  local_658.key_g = 0;
  local_658.key_b = 0;
  local_658.colortype = LCT_RGBA;
  local_658.bitdepth = 8;
  local_658.palette = (uchar *)0x0;
  local_658.palettesize = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  colortype = (state->info_png).color.colortype;
  if (((colortype == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     ((state->info_png).color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    goto LAB_001e4f29;
  }
  if (2 < (state->encoder).zlibsettings.btype) {
    state->error = 0x3d;
    goto LAB_001e4f29;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    goto LAB_001e4f29;
  }
  uVar7 = checkColorValidity(colortype,(state->info_png).color.bitdepth);
  state->error = uVar7;
  if (uVar7 != 0) goto LAB_001e4f29;
  uVar7 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar7;
  if (uVar7 != 0) goto LAB_001e4f29;
  local_680 = &state->info_raw;
  lodepng_info_copy(&local_630,&state->info_png);
  if ((state->encoder).auto_convert != 0) {
    local_460.alpha = 0;
    local_460.numcolors = 0;
    local_460.colored._0_1_ = 0;
    local_460._1_5_ = 0;
    local_460.key._2_2_ = 0;
    local_460.key_r = 0;
    local_460.key_g = 0;
    local_460.key_b = 0;
    local_460.bits = 1;
    local_460.numpixels = 0;
    local_460.allow_palette = 1;
    local_460.allow_greyscale = 1;
    if (((state->info_png).iccp_defined != 0) && (0x13 < (state->info_png).iccp_profile_size)) {
      puVar9 = (state->info_png).iccp_profile;
      if (((puVar9[0x10] == 'G') && ((puVar9[0x11] == 'R' && (puVar9[0x12] == 'A')))) &&
         (puVar9[0x13] == 'Y')) {
        local_460.allow_palette = 0;
        local_460.allow_greyscale = 1;
      }
      if ((((puVar9[0x10] == 'R') && (puVar9[0x11] == 'G')) && (puVar9[0x12] == 'B')) &&
         (puVar9[0x13] == ' ')) {
        local_460._1064_8_ = local_460._1064_8_ & 0xffffffff;
      }
    }
    uVar7 = lodepng_compute_color_stats(&local_460,image,w,h,local_680);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_001e4f29;
    local_690 = (LodePNGEncoderSettings *)&(state->info_png).color;
    if ((state->info_png).background_defined != 0) {
      local_65c = 0;
      local_660 = 0;
      local_664 = 0;
      local_488.key_defined = 0;
      local_488.key_r = 0;
      local_488.key_g = 0;
      local_488.key_b = 0;
      local_488.palette = (uchar *)0x0;
      local_488.palettesize = 0;
      local_488.colortype = LCT_RGB;
      local_488.bitdepth = 0x10;
      uVar7 = (state->info_png).background_g;
      lodepng_convert_rgb(&local_65c,&local_660,&local_664,(state->info_png).background_r,uVar7,
                          (state->info_png).background_b,&local_488,(LodePNGColorMode *)local_690);
      uVar7 = lodepng_color_stats_add(&local_460,local_65c,local_660,local_664,uVar7);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    uVar7 = auto_choose_color(&local_658,local_680,&local_460);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_001e4f29;
    if ((state->info_png).sbit_defined == 0) {
      bVar15 = true;
    }
    else {
      local_684 = (state->info_png).sbit_r;
      uVar7 = (state->info_png).sbit_g;
      uVar14 = uVar7;
      if (uVar7 < local_684) {
        uVar14 = local_684;
      }
      uVar2 = (state->info_png).sbit_b;
      uVar3 = (state->info_png).sbit_a;
      if (uVar14 <= uVar2) {
        uVar14 = uVar2;
      }
      if (uVar14 <= uVar3) {
        uVar14 = uVar3;
      }
      if ((uVar7 == 0 || uVar7 == local_684) && (uVar2 == 0 || uVar2 == local_684)) {
        bVar6 = uVar3 == local_684 || uVar3 == 0;
      }
      else {
        bVar6 = false;
      }
      bVar15 = local_658.colortype == LCT_PALETTE;
      bVar15 = ((local_630.color.colortype == LCT_RGB && bVar15) && uVar14 < 9 ||
               local_630.color.colortype == LCT_PALETTE && bVar15) ||
               (uVar3 == 8 && uVar14 < 9) && (local_630.color.colortype == LCT_RGBA && bVar15);
      if ((((local_630.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB) &&
          (local_630.color.bitdepth == 0x10)) && (uVar14 < 9)) {
        bVar15 = local_658.bitdepth == 8 && local_658.colortype == local_630.color.colortype ||
                 bVar15;
      }
      if (((bool)((local_658.colortype != LCT_PALETTE && local_630.color.colortype != LCT_PALETTE) &
                 bVar6)) && (local_684 == local_658.bitdepth)) {
        bVar15 = true;
      }
    }
    if ((((((state->encoder).force_palette == 0) || ((local_630.color._0_8_ & 0xfffffffb) == 0)) ||
         ((local_658._0_8_ & 0xfffffffb) != 0)) &&
        ((bVar15 &&
         (lodepng_color_mode_copy(&local_630.color,&local_658),
         (state->info_png).background_defined != 0)))) &&
       (uVar7 = lodepng_convert_rgb(&local_630.background_r,&local_630.background_g,
                                    &local_630.background_b,(state->info_png).background_r,
                                    (state->info_png).background_g,(state->info_png).background_b,
                                    &local_630.color,(LodePNGColorMode *)local_690), uVar7 != 0)) {
      state->error = 0x68;
      goto LAB_001e4f29;
    }
  }
  if ((state->info_png).iccp_defined == 0) {
LAB_001e5378:
    local_690 = &state->encoder;
    iVar8 = lodepng_color_mode_equal(local_680,&local_630.color);
    if (iVar8 == 0) {
      local_684 = local_630.color.bitdepth;
      uVar7 = getNumColorChannels(local_630.color.colortype);
      uVar11 = (ulong)(uVar7 * local_684) * (ulong)h * (ulong)w + 7;
      puVar9 = (uchar *)malloc(uVar11 >> 3);
      if (uVar11 < 8 || puVar9 != (uchar *)0x0) {
        if (state->error == 0) {
          uVar7 = lodepng_convert(puVar9,image,&local_630.color,local_680,w,h);
          state->error = uVar7;
          if (uVar7 == 0) {
            uVar7 = preProcessScanlines(&local_678,&local_670,puVar9,w,h,&local_630,local_690);
            state->error = uVar7;
            free(puVar9);
            goto joined_r0x001e598d;
          }
        }
      }
      else {
        state->error = 0x53;
      }
      free(puVar9);
      goto LAB_001e4f29;
    }
    uVar7 = preProcessScanlines(&local_678,&local_670,image,w,h,&local_630,local_690);
    state->error = uVar7;
joined_r0x001e598d:
    if (uVar7 != 0) goto LAB_001e4f29;
    local_6a8.size = 8;
    puVar9 = (uchar *)malloc(8);
    if (puVar9 == (uchar *)0x0) {
      state->error = 0x53;
      goto LAB_001e4f29;
    }
    local_6a8.allocsize = 8;
    puVar9[0] = 0x89;
    puVar9[1] = 'P';
    puVar9[2] = 'N';
    puVar9[3] = 'G';
    puVar9[4] = '\r';
    puVar9[5] = '\n';
    puVar9[6] = '\x1a';
    puVar9[7] = '\n';
    state->error = 0;
    local_6a8.data = puVar9;
    uVar7 = addChunk_IHDR(&local_6a8,w,h,local_630.color.colortype,local_630.color.bitdepth,
                          local_630.interlace_method);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_001e4f29;
    if (local_630.unknown_chunks_data[0] != (uchar *)0x0) {
      uVar7 = addUnknownChunks(&local_6a8,local_630.unknown_chunks_data[0],
                               local_630.unknown_chunks_size[0]);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.cicp_defined != 0) {
      uVar7 = addChunk_cICP(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.mdcv_defined != 0) {
      uVar7 = addChunk_mDCv(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.clli_defined != 0) {
      uVar7 = addChunk_cLLi(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.iccp_defined != 0) {
      uVar7 = addChunk_iCCP(&local_6a8,&local_630,&local_690->zlibsettings);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.srgb_defined != 0) {
      local_460.colored._0_1_ = (undefined1)local_630.srgb_intent;
      uVar7 = lodepng_chunk_createv(&local_6a8,1,"sRGB",(uchar *)&local_460);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.gama_defined != 0) {
      uVar7 = addChunk_gAMA(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.chrm_defined != 0) {
      uVar7 = addChunk_cHRM(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if ((state->info_png).sbit_defined != 0) {
      uVar7 = addChunk_sBIT(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.exif_defined != 0) {
      uVar7 = lodepng_chunk_createv(&local_6a8,local_630._152_8_ & 0xffffffff,"eXIf",local_630.exif)
      ;
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.color.colortype == LCT_PALETTE) {
      uVar7 = addChunk_PLTE(&local_6a8,&local_630.color);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (((state->encoder).force_palette != 0) &&
       ((local_630.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB)) {
      uVar7 = addChunk_PLTE(&local_6a8,&local_630.color);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    uVar7 = addChunk_tRNS(&local_6a8,&local_630.color);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_001e4f29;
    if (local_630.background_defined != 0) {
      uVar7 = addChunk_bKGD(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.phys_defined != 0) {
      uVar7 = addChunk_pHYs(&local_6a8,&local_630);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.unknown_chunks_data[1] != (uchar *)0x0) {
      uVar7 = addUnknownChunks(&local_6a8,local_630.unknown_chunks_data[1],
                               local_630.unknown_chunks_size[1]);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    uVar7 = addChunk_IDAT(&local_6a8,local_678,local_670,&local_690->zlibsettings);
    state->error = uVar7;
    if (uVar7 != 0) goto LAB_001e4f29;
    if (local_630.time_defined != 0) {
      uVar7 = addChunk_tIME(&local_6a8,&local_630.time);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    if (local_630.text_num == 0) {
      if ((state->encoder).add_id != 0) goto LAB_001e59a1;
    }
    else {
      sVar13 = 0;
      do {
        sVar10 = sVar13;
        pcVar4 = local_630.text_keys[sVar10];
        uVar11 = 0xffffffffffffffff;
        do {
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (pcVar4[lVar12] != '\0');
        if (0x4f < uVar11) goto LAB_001e5abd;
        lVar12 = 0;
        do {
          pcVar1 = pcVar4 + lVar12;
          lVar12 = lVar12 + 1;
        } while (*pcVar1 != '\0');
        if (lVar12 == 1) goto LAB_001e5acc;
        if ((state->encoder).text_compression == 0) {
          uVar7 = addChunk_tEXt(&local_6a8,pcVar4,local_630.text_strings[sVar10]);
        }
        else {
          uVar7 = addChunk_zTXt(&local_6a8,pcVar4,local_630.text_strings[sVar10],
                                &local_690->zlibsettings);
        }
        state->error = uVar7;
        if (uVar7 != 0) goto LAB_001e4f29;
        sVar13 = sVar10 + 1;
      } while (sVar13 != local_630.text_num);
      if ((state->encoder).add_id != 0) {
        if (sVar13 != 0) {
          sVar13 = 0xffffffffffffffff;
          do {
            pcVar4 = local_630.text_keys[sVar13 + 1];
            if (((*pcVar4 == 'L') && (pcVar4[1] == 'o')) &&
               ((pcVar4[2] == 'd' &&
                ((((pcVar4[3] == 'e' && (pcVar4[4] == 'P')) && (pcVar4[5] == 'N')) &&
                 ((pcVar4[6] == 'G' && (pcVar4[7] == '\0')))))))) goto LAB_001e59c7;
            sVar13 = sVar13 + 1;
          } while (sVar10 != sVar13);
        }
LAB_001e59a1:
        uVar7 = addChunk_tEXt(&local_6a8,"LodePNG",LODEPNG_VERSION_STRING);
        state->error = uVar7;
        if (uVar7 != 0) goto LAB_001e4f29;
      }
    }
LAB_001e59c7:
    if (local_630.itext_num != 0) {
      sVar13 = 0;
      do {
        pcVar4 = local_630.itext_keys[sVar13];
        uVar11 = 0xffffffffffffffff;
        do {
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (pcVar4[lVar12] != '\0');
        if (0x4f < uVar11) goto LAB_001e5abd;
        lVar12 = 0;
        do {
          pcVar1 = pcVar4 + lVar12;
          lVar12 = lVar12 + 1;
        } while (*pcVar1 != '\0');
        if (lVar12 == 1) goto LAB_001e5acc;
        uVar7 = addChunk_iTXt(&local_6a8,(state->encoder).text_compression,pcVar4,
                              local_630.itext_langtags[sVar13],local_630.itext_transkeys[sVar13],
                              local_630.itext_strings[sVar13],&local_690->zlibsettings);
        state->error = uVar7;
        if (uVar7 != 0) goto LAB_001e4f29;
        sVar13 = sVar13 + 1;
      } while (sVar13 != local_630.itext_num);
    }
    if (local_630.unknown_chunks_data[2] != (uchar *)0x0) {
      uVar7 = addUnknownChunks(&local_6a8,local_630.unknown_chunks_data[2],
                               local_630.unknown_chunks_size[2]);
      state->error = uVar7;
      if (uVar7 != 0) goto LAB_001e4f29;
    }
    uVar7 = lodepng_chunk_createv(&local_6a8,0,"IEND",(uchar *)0x0);
  }
  else {
    bVar6 = false;
    bVar15 = false;
    bVar5 = bVar15;
    if ((state->info_png).iccp_profile_size < 0x14) {
LAB_001e5356:
      bVar15 = bVar5;
      bVar6 = false;
    }
    else {
      puVar9 = (state->info_png).iccp_profile;
      bVar5 = bVar6;
      if (puVar9[0x10] == 'R') {
        if ((puVar9[0x11] == 'G') && (puVar9[0x12] == 'B')) {
          bVar5 = puVar9[0x13] == ' ';
        }
        goto LAB_001e5356;
      }
      bVar5 = bVar15;
      if (((puVar9[0x10] != 'G') || (bVar5 = bVar6, puVar9[0x11] != 'R')) || (puVar9[0x12] != 'A'))
      goto LAB_001e5356;
      bVar6 = puVar9[0x13] == 'Y';
    }
    if (!bVar15 && bVar6 == false) {
      state->error = 100;
      goto LAB_001e4f29;
    }
    if (bVar6 == ((local_630.color._0_8_ & 0xfffffffb) == 0)) goto LAB_001e5378;
    uVar7 = 0x66 - ((state->encoder).auto_convert == 0);
  }
  state->error = uVar7;
LAB_001e4f29:
  lodepng_info_cleanup(&local_630);
  free(local_678);
  if (local_658.palette != (uchar *)0x0) {
    free(local_658.palette);
  }
  *out = local_6a8.data;
  *outsize = local_6a8.size;
  return state->error;
LAB_001e5abd:
  state->error = 0x42;
  goto LAB_001e4f29;
LAB_001e5acc:
  state->error = 0x43;
  goto LAB_001e4f29;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state) {
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;
  ucvector outv = ucvector_init(NULL, 0);
  LodePNGInfo info;
  const LodePNGInfo* info_png = &state->info_png;
  LodePNGColorMode auto_color;

  lodepng_info_init(&info);
  lodepng_color_mode_init(&auto_color);

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  /*check input values validity*/
  if((info_png->color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info_png->color.palettesize == 0 || info_png->color.palettesize > 256)) {
    /*this error is returned even if auto_convert is enabled and thus encoder could
    generate the palette by itself: while allowing this could be possible in theory,
    it may complicate the code or edge cases, and always requiring to give a palette
    when setting this color type is a simpler contract*/
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    goto cleanup;
  }
  if(state->encoder.zlibsettings.btype > 2) {
    state->error = 61; /*error: invalid btype*/
    goto cleanup;
  }
  if(info_png->interlace_method > 1) {
    state->error = 71; /*error: invalid interlace mode*/
    goto cleanup;
  }
  state->error = checkColorValidity(info_png->color.colortype, info_png->color.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) goto cleanup; /*error: invalid color type given*/

  /* color convert and compute scanline filter types */
  lodepng_info_copy(&info, &state->info_png);
  if(state->encoder.auto_convert) {
    LodePNGColorStats stats;
    unsigned allow_convert = 1;
    lodepng_color_stats_init(&stats);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->iccp_defined &&
        isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use palette with a GRAY ICC profile, even
      if the palette has only gray colors, so disallow it.*/
      stats.allow_palette = 0;
    }
    if(info_png->iccp_defined &&
        isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size)) {
      /*the PNG specification does not allow to use grayscale color with RGB ICC profile, so disallow gray.*/
      stats.allow_greyscale = 0;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = lodepng_compute_color_stats(&stats, image, w, h, &state->info_raw);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->background_defined) {
      /*the background chunk's color must be taken into account as well*/
      unsigned r = 0, g = 0, b = 0;
      LodePNGColorMode mode16 = lodepng_color_mode_make(LCT_RGB, 16);
      lodepng_convert_rgb(&r, &g, &b,
          info_png->background_r, info_png->background_g, info_png->background_b, &mode16, &info_png->color);
      state->error = lodepng_color_stats_add(&stats, r, g, b, 65535);
      if(state->error) goto cleanup;
    }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    state->error = auto_choose_color(&auto_color, &state->info_raw, &stats);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    if(info_png->sbit_defined) {
      /*if sbit is defined, due to strict requirements of which sbit values can be present for which color modes,
      auto_convert can't be done in many cases. However, do support a few cases here.
      TODO: more conversions may be possible, and it may also be possible to get a more appropriate color type out of
            auto_choose_color if knowledge about sbit is used beforehand
      */
      unsigned sbit_max = LODEPNG_MAX(LODEPNG_MAX(LODEPNG_MAX(info_png->sbit_r, info_png->sbit_g),
                           info_png->sbit_b), info_png->sbit_a);
      unsigned equal = (!info_png->sbit_g || info_png->sbit_g == info_png->sbit_r)
                    && (!info_png->sbit_b || info_png->sbit_b == info_png->sbit_r)
                    && (!info_png->sbit_a || info_png->sbit_a == info_png->sbit_r);
      allow_convert = 0;
      if(info.color.colortype == LCT_PALETTE &&
         auto_color.colortype == LCT_PALETTE) {
        /* input and output are palette, and in this case it may happen that palette data is
        expected to be copied from info_raw into the info_png */
        allow_convert = 1;
      }
      /*going from 8-bit RGB to palette (or 16-bit as long as sbit_max <= 8) is possible
      since both are 8-bit RGB for sBIT's purposes*/
      if(info.color.colortype == LCT_RGB &&
         auto_color.colortype == LCT_PALETTE && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 8-bit RGBA to palette is also ok but only if sbit_a is exactly 8*/
      if(info.color.colortype == LCT_RGBA && auto_color.colortype == LCT_PALETTE &&
         info_png->sbit_a == 8 && sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going from 16-bit RGB(A) to 8-bit RGB(A) is ok if all sbit values are <= 8*/
      if((info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA) && info.color.bitdepth == 16 &&
         auto_color.colortype == info.color.colortype && auto_color.bitdepth == 8 &&
         sbit_max <= 8) {
        allow_convert = 1;
      }
      /*going to less channels is ok if all bit values are equal (all possible values in sbit,
        as well as the chosen bitdepth of the result). Due to how auto_convert works,
        we already know that auto_color.colortype has less than or equal amount of channels than
        info.colortype. Palette is not used here. This conversion is not allowed if
        info_png->sbit_r < auto_color.bitdepth, because specifically for alpha, non-presence of
        an sbit value heavily implies that alpha's bit depth is equal to the PNG bit depth (rather
        than the bit depths set in the r, g and b sbit values, by how the PNG specification describes
        handling tRNS chunk case with sBIT), so be conservative here about ignoring user input.*/
      if(info.color.colortype != LCT_PALETTE && auto_color.colortype != LCT_PALETTE &&
         equal && info_png->sbit_r == auto_color.bitdepth) {
        allow_convert = 1;
      }
    }
#endif
    if(state->encoder.force_palette) {
      if(info.color.colortype != LCT_GREY && info.color.colortype != LCT_GREY_ALPHA &&
         (auto_color.colortype == LCT_GREY || auto_color.colortype == LCT_GREY_ALPHA)) {
        /*user speficially forced a PLTE palette, so cannot convert to grayscale types because
        the PNG specification only allows writing a suggested palette in PLTE for truecolor types*/
        allow_convert = 0;
      }
    }
    if(allow_convert) {
      lodepng_color_mode_copy(&info.color, &auto_color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*also convert the background chunk*/
      if(info_png->background_defined) {
        if(lodepng_convert_rgb(&info.background_r, &info.background_g, &info.background_b,
            info_png->background_r, info_png->background_g, info_png->background_b, &info.color, &info_png->color)) {
          state->error = 104;
          goto cleanup;
        }
      }
#endif /* LODEPNG_COMPILE_ANCILLARY_CHUNKS */
    }
  }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  if(info_png->iccp_defined) {
    unsigned gray_icc = isGrayICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned rgb_icc = isRGBICCProfile(info_png->iccp_profile, info_png->iccp_profile_size);
    unsigned gray_png = info.color.colortype == LCT_GREY || info.color.colortype == LCT_GREY_ALPHA;
    if(!gray_icc && !rgb_icc) {
      state->error = 100; /* Disallowed profile color type for PNG */
      goto cleanup;
    }
    if(gray_icc != gray_png) {
      /*Not allowed to use RGB/RGBA/palette with GRAY ICC profile or vice versa,
      or in case of auto_convert, it wasn't possible to find appropriate model*/
      state->error = state->encoder.auto_convert ? 102 : 101;
      goto cleanup;
    }
  }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  if(!lodepng_color_mode_equal(&state->info_raw, &info.color)) {
    unsigned char* converted;
    size_t size = ((size_t)w * (size_t)h * (size_t)lodepng_get_bpp(&info.color) + 7u) / 8u;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error) {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) {
      state->error = preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    }
    lodepng_free(converted);
    if(state->error) goto cleanup;
  } else {
    state->error = preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);
    if(state->error) goto cleanup;
  }

  /* output all PNG chunks */ {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    state->error = writeSignature(&outv);
    if(state->error) goto cleanup;
    /*IHDR*/
    state->error = addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) goto cleanup;
    }
    /*color profile chunks must come before PLTE */
    if(info.cicp_defined) {
      state->error = addChunk_cICP(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.mdcv_defined) {
      state->error = addChunk_mDCv(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.clli_defined) {
      state->error = addChunk_cLLi(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.iccp_defined) {
      state->error = addChunk_iCCP(&outv, &info, &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }
    if(info.srgb_defined) {
      state->error = addChunk_sRGB(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.gama_defined) {
      state->error = addChunk_gAMA(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.chrm_defined) {
      state->error = addChunk_cHRM(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info_png->sbit_defined) {
      state->error = addChunk_sBIT(&outv, &info);
      if(state->error) goto cleanup;
    }
    if(info.exif_defined) {
      state->error = addChunk_eXIf(&outv, &info);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE) {
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA)) {
      /*force_palette means: write suggested palette for truecolor in PLTE chunk*/
      state->error = addChunk_PLTE(&outv, &info.color);
      if(state->error) goto cleanup;
    }
    /*tRNS (this will only add if when necessary) */
    state->error = addChunk_tRNS(&outv, &info.color);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) {
      state->error = addChunk_bKGD(&outv, &info);
      if(state->error) goto cleanup;
    }
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) {
      state->error = addChunk_pHYs(&outv, &info);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) goto cleanup;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) {
      state->error = addChunk_tIME(&outv, &info.time);
      if(state->error) goto cleanup;
    }
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i) {
      if(lodepng_strlen(info.text_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.text_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      if(state->encoder.text_compression) {
        state->error = addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
        if(state->error) goto cleanup;
      } else {
        state->error = addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
        if(state->error) goto cleanup;
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id) {
      unsigned already_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i) {
        const char* k = info.text_keys[i];
        /* Could use strcmp, but we're not calling or reimplementing this C library function for this use only */
        if(k[0] == 'L' && k[1] == 'o' && k[2] == 'd' && k[3] == 'e' &&
           k[4] == 'P' && k[5] == 'N' && k[6] == 'G' && k[7] == '\0') {
          already_added_id_text = 1;
          break;
        }
      }
      if(already_added_id_text == 0) {
        state->error = addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
        if(state->error) goto cleanup;
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i) {
      if(lodepng_strlen(info.itext_keys[i]) > 79) {
        state->error = 66; /*text chunk too large*/
        goto cleanup;
      }
      if(lodepng_strlen(info.itext_keys[i]) < 1) {
        state->error = 67; /*text chunk too small*/
        goto cleanup;
      }
      state->error = addChunk_iTXt(
          &outv, state->encoder.text_compression,
          info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
          &state->encoder.zlibsettings);
      if(state->error) goto cleanup;
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2]) {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) goto cleanup;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    state->error = addChunk_IEND(&outv);
    if(state->error) goto cleanup;
  }

cleanup:
  lodepng_info_cleanup(&info);
  lodepng_free(data);
  lodepng_color_mode_cleanup(&auto_color);

  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}